

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

uint JsUtil::
     BaseDictionary<int,_BVSparse<Memory::JitArenaAllocator>_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
     ::GetBucket(hash_t hashCode,int bucketCount,int modFunctionIndex)

{
  hash_t hVar1;
  
  hVar1 = PowerOf2Policy::GetBucket(hashCode >> 1,bucketCount,modFunctionIndex);
  return hVar1;
}

Assistant:

static uint GetBucket(hash_t hashCode, int bucketCount, int modFunctionIndex)
        {
            return SizePolicy::GetBucket(UNTAGHASH(hashCode), bucketCount, modFunctionIndex);
        }